

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

ImporterPtr __thiscall libcellml::Importer::create(Importer *this,bool strict)

{
  Importer *this_00;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ImporterPtr IVar2;
  bool strict_local;
  shared_ptr<libcellml::Importer> *importer;
  
  this_00 = (Importer *)operator_new(0x20);
  Importer(this_00);
  std::shared_ptr<libcellml::Importer>::shared_ptr<libcellml::Importer,void>
            ((shared_ptr<libcellml::Importer> *)this,this_00);
  peVar1 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  Strict::setStrict(&peVar1->super_Strict,strict);
  IVar2.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  IVar2.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ImporterPtr)IVar2.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ImporterPtr Importer::create(bool strict) noexcept
{
    auto importer = std::shared_ptr<Importer> {new Importer {}};
    importer->setStrict(strict);
    return importer;
}